

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

NodeAVL * avlRotateRight(NodeAVL *p)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  NodeAVL *pNVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  pNVar1 = p->left;
  pNVar2 = pNVar1->right;
  p->left = pNVar2;
  if (pNVar2 == (NodeAVL *)0x0) {
    pNVar1->right = p;
    pNVar2 = p->parent;
    p->parent = pNVar1;
    pNVar1->parent = pNVar2;
    iVar6 = 0;
  }
  else {
    pNVar2->parent = p;
    pNVar1->right = p;
    pNVar3 = p->parent;
    p->parent = pNVar1;
    pNVar1->parent = pNVar3;
    iVar6 = pNVar2->height;
  }
  iVar5 = 0;
  iVar4 = 0;
  if (p->right != (NodeAVL *)0x0) {
    iVar4 = p->right->height;
  }
  if (iVar4 < iVar6) {
    iVar4 = iVar6;
  }
  iVar4 = iVar4 + 1;
  p->height = iVar4;
  if (pNVar1->left != (NodeAVL *)0x0) {
    iVar5 = pNVar1->left->height;
  }
  if (p == (NodeAVL *)0x0) {
    iVar4 = 0;
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  pNVar1->height = iVar4 + 1;
  return pNVar1;
}

Assistant:

static
NodeAVL* avlRotateRight( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRotateRight id=%d\n", p->id );
    #endif
    NodeAVL* q = p->left;
    p->left = q->right;
    if( q->right ) q->right->parent = p;
    q->right = p;
    NodeAVL* pp = p->parent;
    p->parent = q;
    q->parent = pp;
    avlFixHeight(p);
    avlFixHeight(q);
    return q;
}